

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosComm.cpp
# Opt level: O2

Req __thiscall
adios2::helper::CommImpl::MakeReq
          (CommImpl *this,
          unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
          *impl)

{
  _Head_base<0UL,_adios2::helper::CommReqImpl_*,_false> local_10;
  
  local_10._M_head_impl =
       (impl->_M_t).
       super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
       .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
  (impl->_M_t).
  super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl = (CommReqImpl *)0x0;
  Comm::Req::Req((Req *)this,
                 (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
                  *)&local_10);
  if (local_10._M_head_impl != (CommReqImpl *)0x0) {
    (*(local_10._M_head_impl)->_vptr_CommReqImpl[1])();
  }
  return (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
         )(unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
           )this;
}

Assistant:

Comm::Req CommImpl::MakeReq(std::unique_ptr<CommReqImpl> impl)
{
    return Comm::Req(std::move(impl));
}